

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChValueSpecific<char[12]>::CallOut(ChValueSpecific<char[12]> *this,ChArchiveOut *marchive)

{
  char (*t) [12];
  char *custom_name;
  ChNameValue<char[12]> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  ChValueSpecific<char[12]> *this_local;
  
  t = this->_ptr_to_val;
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  custom_name = (char *)std::__cxx11::string::c_str();
  make_ChNameValue<char[12]>(&local_30,"*this->_ptr_to_val",t,custom_name,'\0');
  ChArchiveOut::out<char,12ul>(marchive,&local_30);
  ChNameValue<char[12]>::~ChNameValue(&local_30);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}